

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O0

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx *dctx,void *src,size_t srcSize)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  U16 UVar4;
  U32 UVar5;
  uint uVar6;
  bool bVar7;
  long local_a8;
  size_t lhSize_2;
  size_t litSize_2;
  U32 lhlCode_2;
  U32 lhlCode_1;
  size_t lhSize_1;
  size_t litSize_1;
  size_t _pos;
  size_t _size;
  char *_ptr;
  size_t hufSuccess;
  U32 lhc;
  U32 lhlCode;
  U32 singleStream;
  size_t litCSize;
  size_t litSize;
  size_t lhSize;
  symbolEncodingType_e litEncType;
  BYTE *istart;
  size_t srcSize_local;
  void *src_local;
  ZSTD_DCtx *dctx_local;
  
  if (srcSize < 3) {
    return 0xffffffffffffffec;
  }
  bVar2 = *src & 3;
  switch(bVar2) {
  case 0:
    switch(*src >> 2 & 3) {
    case 0:
    case 2:
    default:
      _lhlCode_2 = 1;
      lhSize_1 = (size_t)((int)(uint)*src >> 3);
      break;
    case 1:
      _lhlCode_2 = 2;
      UVar4 = MEM_readLE16(src);
      lhSize_1 = (size_t)((int)(uint)UVar4 >> 4);
      break;
    case 3:
      _lhlCode_2 = 3;
      UVar5 = MEM_readLE24(src);
      lhSize_1 = (size_t)(UVar5 >> 4);
    }
    if (srcSize < _lhlCode_2 + lhSize_1 + 8) {
      if (srcSize < lhSize_1 + _lhlCode_2) {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
      }
      else {
        memcpy(dctx->litBuffer,(void *)((long)src + _lhlCode_2),lhSize_1);
        dctx->litPtr = dctx->litBuffer;
        dctx->litSize = lhSize_1;
        memset(dctx->litBuffer + dctx->litSize,0,8);
        dctx_local = (ZSTD_DCtx *)(_lhlCode_2 + lhSize_1);
      }
    }
    else {
      dctx->litPtr = (BYTE *)((long)src + _lhlCode_2);
      dctx->litSize = lhSize_1;
      dctx_local = (ZSTD_DCtx *)(_lhlCode_2 + lhSize_1);
    }
    break;
  case 1:
    switch(*src >> 2 & 3) {
    case 0:
    case 2:
    default:
      local_a8 = 1;
      lhSize_2 = (size_t)((int)(uint)*src >> 3);
      break;
    case 1:
      local_a8 = 2;
      UVar4 = MEM_readLE16(src);
      lhSize_2 = (size_t)((int)(uint)UVar4 >> 4);
      break;
    case 3:
      local_a8 = 3;
      UVar5 = MEM_readLE24(src);
      lhSize_2 = (size_t)(UVar5 >> 4);
      if (srcSize < 4) {
        return 0xffffffffffffffec;
      }
    }
    if (lhSize_2 < 0x20001) {
      memset(dctx->litBuffer,(uint)*(byte *)((long)src + local_a8),lhSize_2 + 8);
      dctx->litPtr = dctx->litBuffer;
      dctx->litSize = lhSize_2;
      dctx_local = (ZSTD_DCtx *)(local_a8 + 1);
    }
    else {
      dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
    }
    break;
  case 2:
    goto switchD_006624b9_caseD_2;
  case 3:
    if (dctx->litEntropy == 0) {
      return 0xffffffffffffffe2;
    }
switchD_006624b9_caseD_2:
    if (srcSize < 5) {
      return 0xffffffffffffffec;
    }
    bVar7 = false;
    bVar1 = *src;
    bVar3 = bVar1 >> 2 & 3;
    UVar5 = MEM_readLE32(src);
    if (bVar3 < 2) {
LAB_0066253a:
      bVar7 = (bVar1 >> 2 & 3) == 0;
      litSize = 3;
      litCSize = (size_t)(UVar5 >> 4 & 0x3ff);
      _lhlCode = (ulong)(UVar5 >> 0xe & 0x3ff);
    }
    else if (bVar3 == 2) {
      litSize = 4;
      litCSize = (size_t)(UVar5 >> 4 & 0x3fff);
      _lhlCode = (ulong)(UVar5 >> 0x12);
    }
    else {
      if (bVar3 != 3) goto LAB_0066253a;
      litSize = 5;
      litCSize = (size_t)(UVar5 >> 4 & 0x3ffff);
      _lhlCode = (ulong)((UVar5 >> 0x16) + (uint)*(byte *)((long)src + 4) * 0x400);
    }
    if (litCSize < 0x20001) {
      if (srcSize < _lhlCode + litSize) {
        dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
      }
      else {
        if ((dctx->ddictIsCold != 0) && (0x300 < litCSize)) {
          for (litSize_1 = 0; litSize_1 < 0x4004; litSize_1 = litSize_1 + 0x40) {
          }
        }
        if (bVar2 == 3) {
          if (bVar7) {
            _ptr = (char *)HUF_decompress1X_usingDTable_bmi2
                                     (dctx->litBuffer,litCSize,(void *)((long)src + litSize),
                                      _lhlCode,dctx->HUFptr,dctx->bmi2);
          }
          else {
            _ptr = (char *)HUF_decompress4X_usingDTable_bmi2
                                     (dctx->litBuffer,litCSize,(void *)((long)src + litSize),
                                      _lhlCode,dctx->HUFptr,dctx->bmi2);
          }
        }
        else if (bVar7) {
          _ptr = (char *)HUF_decompress1X1_DCtx_wksp_bmi2
                                   ((dctx->entropy).hufTable,dctx->litBuffer,litCSize,
                                    (void *)((long)src + litSize),_lhlCode,dctx->workspace,0x800,
                                    dctx->bmi2);
        }
        else {
          _ptr = (char *)HUF_decompress4X_hufOnly_wksp_bmi2
                                   ((dctx->entropy).hufTable,dctx->litBuffer,litCSize,
                                    (void *)((long)src + litSize),_lhlCode,dctx->workspace,0x800,
                                    dctx->bmi2);
        }
        uVar6 = ERR_isError((size_t)_ptr);
        if (uVar6 == 0) {
          dctx->litPtr = dctx->litBuffer;
          dctx->litSize = litCSize;
          dctx->litEntropy = 1;
          if (bVar2 == 2) {
            dctx->HUFptr = (dctx->entropy).hufTable;
          }
          memset(dctx->litBuffer + dctx->litSize,0,8);
          dctx_local = (ZSTD_DCtx *)(_lhlCode + litSize);
        }
        else {
          dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
        }
      }
    }
    else {
      dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
    }
    break;
  default:
    dctx_local = (ZSTD_DCtx *)0xffffffffffffffec;
  }
  return (size_t)dctx_local;
}

Assistant:

size_t ZSTD_decodeLiteralsBlock(ZSTD_DCtx* dctx,
                          const void* src, size_t srcSize)   /* note : srcSize < BLOCKSIZE */
{
    if (srcSize < MIN_CBLOCK_SIZE) return ERROR(corruption_detected);

    {   const BYTE* const istart = (const BYTE*) src;
        symbolEncodingType_e const litEncType = (symbolEncodingType_e)(istart[0] & 3);

        switch(litEncType)
        {
        case set_repeat:
            if (dctx->litEntropy==0) return ERROR(dictionary_corrupted);
            /* fall-through */

        case set_compressed:
            if (srcSize < 5) return ERROR(corruption_detected);   /* srcSize >= MIN_CBLOCK_SIZE == 3; here we need up to 5 for case 3 */
            {   size_t lhSize, litSize, litCSize;
                U32 singleStream=0;
                U32 const lhlCode = (istart[0] >> 2) & 3;
                U32 const lhc = MEM_readLE32(istart);
                size_t hufSuccess;
                switch(lhlCode)
                {
                case 0: case 1: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    /* 2 - 2 - 10 - 10 */
                    singleStream = !lhlCode;
                    lhSize = 3;
                    litSize  = (lhc >> 4) & 0x3FF;
                    litCSize = (lhc >> 14) & 0x3FF;
                    break;
                case 2:
                    /* 2 - 2 - 14 - 14 */
                    lhSize = 4;
                    litSize  = (lhc >> 4) & 0x3FFF;
                    litCSize = lhc >> 18;
                    break;
                case 3:
                    /* 2 - 2 - 18 - 18 */
                    lhSize = 5;
                    litSize  = (lhc >> 4) & 0x3FFFF;
                    litCSize = (lhc >> 22) + (istart[4] << 10);
                    break;
                }
                if (litSize > ZSTD_BLOCKSIZE_MAX) return ERROR(corruption_detected);
                if (litCSize + lhSize > srcSize) return ERROR(corruption_detected);

                /* prefetch huffman table if cold */
                if (dctx->ddictIsCold && (litSize > 768 /* heuristic */)) {
                    PREFETCH_AREA(dctx->HUFptr, sizeof(dctx->entropy.hufTable));
                }

                if (litEncType==set_repeat) {
                    if (singleStream) {
                        hufSuccess = HUF_decompress1X_usingDTable_bmi2(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, dctx->bmi2);
                    } else {
                        hufSuccess = HUF_decompress4X_usingDTable_bmi2(
                            dctx->litBuffer, litSize, istart+lhSize, litCSize,
                            dctx->HUFptr, dctx->bmi2);
                    }
                } else {
                    if (singleStream) {
#if defined(HUF_FORCE_DECOMPRESS_X2)
                        hufSuccess = HUF_decompress1X_DCtx_wksp(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace));
#else
                        hufSuccess = HUF_decompress1X1_DCtx_wksp_bmi2(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), dctx->bmi2);
#endif
                    } else {
                        hufSuccess = HUF_decompress4X_hufOnly_wksp_bmi2(
                            dctx->entropy.hufTable, dctx->litBuffer, litSize,
                            istart+lhSize, litCSize, dctx->workspace,
                            sizeof(dctx->workspace), dctx->bmi2);
                    }
                }

                if (HUF_isError(hufSuccess)) return ERROR(corruption_detected);

                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                dctx->litEntropy = 1;
                if (litEncType==set_compressed) dctx->HUFptr = dctx->entropy.hufTable;
                memset(dctx->litBuffer + dctx->litSize, 0, WILDCOPY_OVERLENGTH);
                return litCSize + lhSize;
            }

        case set_basic:
            {   size_t litSize, lhSize;
                U32 const lhlCode = ((istart[0]) >> 2) & 3;
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    litSize = MEM_readLE24(istart) >> 4;
                    break;
                }

                if (lhSize+litSize+WILDCOPY_OVERLENGTH > srcSize) {  /* risk reading beyond src buffer with wildcopy */
                    if (litSize+lhSize > srcSize) return ERROR(corruption_detected);
                    memcpy(dctx->litBuffer, istart+lhSize, litSize);
                    dctx->litPtr = dctx->litBuffer;
                    dctx->litSize = litSize;
                    memset(dctx->litBuffer + dctx->litSize, 0, WILDCOPY_OVERLENGTH);
                    return lhSize+litSize;
                }
                /* direct reference into compressed stream */
                dctx->litPtr = istart+lhSize;
                dctx->litSize = litSize;
                return lhSize+litSize;
            }

        case set_rle:
            {   U32 const lhlCode = ((istart[0]) >> 2) & 3;
                size_t litSize, lhSize;
                switch(lhlCode)
                {
                case 0: case 2: default:   /* note : default is impossible, since lhlCode into [0..3] */
                    lhSize = 1;
                    litSize = istart[0] >> 3;
                    break;
                case 1:
                    lhSize = 2;
                    litSize = MEM_readLE16(istart) >> 4;
                    break;
                case 3:
                    lhSize = 3;
                    litSize = MEM_readLE24(istart) >> 4;
                    if (srcSize<4) return ERROR(corruption_detected);   /* srcSize >= MIN_CBLOCK_SIZE == 3; here we need lhSize+1 = 4 */
                    break;
                }
                if (litSize > ZSTD_BLOCKSIZE_MAX) return ERROR(corruption_detected);
                memset(dctx->litBuffer, istart[lhSize], litSize + WILDCOPY_OVERLENGTH);
                dctx->litPtr = dctx->litBuffer;
                dctx->litSize = litSize;
                return lhSize+1;
            }
        default:
            return ERROR(corruption_detected);   /* impossible */
        }
    }
}